

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_utils.c
# Opt level: O2

void * HPDF_MemSet(void *s,HPDF_BYTE c,HPDF_UINT n)

{
  HPDF_BYTE *b;
  bool bVar1;
  
  while (bVar1 = n != 0, n = n - 1, bVar1) {
    *(HPDF_BYTE *)s = c;
    s = (void *)((long)s + 1);
  }
  return s;
}

Assistant:

void*
HPDF_MemSet  (void        *s,
              HPDF_BYTE    c,
              HPDF_UINT    n)
{
    HPDF_BYTE* b = (HPDF_BYTE*)s;

    while (n > 0) {
        *b = c;
        b++;
        n--;
    }

    return b;
}